

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int on_ack_stream_ack_cached(quicly_conn_t *conn)

{
  long in_RDI;
  int ret;
  quicly_stream_id_t unaff_retaddr;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (*(long *)(in_RDI + 0x9d0) == -0x8000000000000000) {
    iVar1 = 0;
  }
  else {
    iVar1 = on_ack_stream_ack_one
                      (conn,unaff_retaddr,
                       (quicly_sendstate_sent_t *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *(undefined8 *)(in_RDI + 0x9d0) = 0x8000000000000000;
  }
  return iVar1;
}

Assistant:

static int on_ack_stream_ack_cached(quicly_conn_t *conn)
{
    int ret;

    if (conn->stash.on_ack_stream.active_acked_cache.stream_id == INT64_MIN)
        return 0;
    ret = on_ack_stream_ack_one(conn, conn->stash.on_ack_stream.active_acked_cache.stream_id,
                                &conn->stash.on_ack_stream.active_acked_cache.args);
    conn->stash.on_ack_stream.active_acked_cache.stream_id = INT64_MIN;
    return ret;
}